

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assessment_1.cpp
# Opt level: O3

void read_cmd_tokens(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *tokens)

{
  bool bVar1;
  token_code tVar2;
  int iVar3;
  int *piVar4;
  long lVar5;
  undefined8 uVar6;
  bool bVar7;
  int iVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar9;
  float p;
  float fVar10;
  float fVar11;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  tVar2 = get_token_code((tokens->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start);
  switch(tVar2) {
  case ambient:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_48,tokens);
    record_token_rgb(ca,&local_48);
    pvVar9 = &local_48;
    break;
  case diffuse:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_60,tokens);
    record_token_rgb(cr,&local_60);
    pvVar9 = &local_60;
    break;
  case specular:
switchD_0010be61_caseD_3:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_78,tokens);
    record_token_rgb(cp,&local_78);
    pvVar9 = &local_78;
    break;
  case set_pu:
    using_phong = false;
    using_WARD = true;
    using_toon = false;
    using_translucent = false;
    using_sketch = false;
    tokens = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(tokens->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
    piVar4 = __errno_location();
    iVar8 = *piVar4;
    *piVar4 = 0;
    fVar10 = strtof((char *)tokens,(char **)&local_c8);
    if (local_c8 != tokens) {
      if (*piVar4 == 0) {
        *piVar4 = iVar8;
LAB_0010c3e5:
        pu = 1.0 / fVar10;
        return;
      }
      if (*piVar4 != 0x22) goto LAB_0010c3e5;
      std::__throw_out_of_range("stof");
      goto switchD_0010be61_caseD_8;
    }
    goto LAB_0010c4ed;
  case set_pv:
switchD_0010be61_caseD_5:
    using_phong = false;
    using_WARD = true;
    using_toon = false;
    using_translucent = false;
    using_sketch = false;
    tokens = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(tokens->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
    piVar4 = __errno_location();
    iVar8 = *piVar4;
    *piVar4 = 0;
    fVar10 = strtof((char *)tokens,(char **)&local_c8);
    if (local_c8 != tokens) {
      if (*piVar4 == 0) {
        *piVar4 = iVar8;
LAB_0010c3a9:
        pv = 1.0 / fVar10;
        return;
      }
      if (*piVar4 != 0x22) goto LAB_0010c3a9;
      std::__throw_out_of_range("stof");
      goto switchD_0010be61_caseD_d;
    }
    goto LAB_0010c4c9;
  case set_p:
    using_phong = true;
    using_WARD = false;
    using_toon = false;
    using_translucent = false;
    using_sketch = false;
    pvVar9 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(tokens->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
    piVar4 = __errno_location();
    iVar8 = *piVar4;
    *piVar4 = 0;
    lVar5 = strtol((char *)pvVar9,(char **)&local_c8,10);
    if (local_c8 == pvVar9) goto LAB_0010c4f9;
    iVar3 = (int)lVar5;
    if ((iVar3 == lVar5) && (*piVar4 != 0x22)) {
      if (*piVar4 != 0) {
        ::p = iVar3;
        return;
      }
      *piVar4 = iVar8;
      ::p = iVar3;
      return;
    }
    goto LAB_0010c51d;
  case add_dl:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_90,tokens);
    record_token_light(dls,dl_cs,&local_90);
    pvVar9 = &local_90;
    break;
  case add_pl:
switchD_0010be61_caseD_8:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_a8,tokens);
    record_token_light(pls,pl_cs,&local_a8);
    pvVar9 = &local_a8;
    break;
  case toon:
switchD_0010be61_caseD_9:
    using_phong = true;
    using_WARD = false;
    using_toon = true;
    using_translucent = false;
    using_sketch = false;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_c0,tokens);
    record_token_rgb(cc1,&local_c0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c0);
    pvVar9 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(tokens->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[4]._M_dataplus._M_p;
    piVar4 = __errno_location();
    iVar8 = *piVar4;
    *piVar4 = 0;
    fVar10 = strtof((char *)pvVar9,(char **)&local_c8);
    if (local_c8 == pvVar9) goto LAB_0010c511;
    iVar3 = *piVar4;
    if (iVar3 == 0) {
      *piVar4 = iVar8;
    }
    else {
      iVar8 = iVar3;
      if (iVar3 == 0x22) {
        fVar10 = (float)std::__throw_out_of_range("stof");
        goto LAB_0010c36b;
      }
    }
    pvVar9 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(tokens->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[5]._M_dataplus._M_p;
    cc2[0] = fVar10;
    *piVar4 = 0;
    fVar10 = strtof((char *)pvVar9,(char **)&local_c8);
    if (local_c8 != pvVar9) {
      iVar3 = *piVar4;
      if (iVar3 == 0) {
LAB_0010c45f:
        *piVar4 = iVar8;
        iVar3 = iVar8;
      }
      else if (iVar3 == 0x22) {
        fVar10 = (float)std::__throw_out_of_range("stof");
        goto LAB_0010c45f;
      }
      pvVar9 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(tokens->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start[6]._M_dataplus._M_p;
      cc2[1] = fVar10;
      *piVar4 = 0;
      fVar10 = strtof((char *)pvVar9,(char **)&local_c8);
      if (local_c8 != pvVar9) {
        if (*piVar4 != 0) {
          if (*piVar4 != 0x22) {
            cc2[2] = fVar10;
            return;
          }
          fVar10 = (float)std::__throw_out_of_range("stof");
        }
        *piVar4 = iVar3;
        cc2[2] = fVar10;
        return;
      }
      goto LAB_0010c535;
    }
    goto LAB_0010c529;
  case set_toon_layers:
switchD_0010be61_caseD_a:
    using_phong = true;
    using_WARD = false;
    using_toon = true;
    using_translucent = false;
    using_sketch = false;
    tokens = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(tokens->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
    piVar4 = __errno_location();
    iVar8 = *piVar4;
    *piVar4 = 0;
    fVar10 = strtof((char *)tokens,(char **)&local_c8);
    if (local_c8 != tokens) {
      if (*piVar4 == 0) {
        *piVar4 = iVar8;
        toonl = fVar10;
        return;
      }
      if (*piVar4 != 0x22) {
        toonl = fVar10;
        return;
      }
      std::__throw_out_of_range("stof");
      goto switchD_0010be61_caseD_3;
    }
    goto LAB_0010c4e1;
  case set_depth:
    using_translucent = true;
    using_phong = false;
    using_WARD = false;
    using_toon = false;
    using_sketch = false;
    tokens = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(tokens->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
    piVar4 = __errno_location();
    iVar8 = *piVar4;
    *piVar4 = 0;
    fVar10 = strtof((char *)tokens,(char **)&local_c8);
    if (local_c8 != tokens) {
      if (*piVar4 == 0) {
        *piVar4 = iVar8;
        depth = fVar10;
        return;
      }
      if (*piVar4 != 0x22) {
        depth = fVar10;
        return;
      }
      std::__throw_out_of_range("stof");
      goto switchD_0010be61_caseD_9;
    }
    goto LAB_0010c505;
  case set_dd:
    using_translucent = true;
    using_phong = false;
    using_WARD = false;
    using_toon = false;
    using_sketch = false;
    tokens = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(tokens->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
    piVar4 = __errno_location();
    iVar8 = *piVar4;
    *piVar4 = 0;
    fVar10 = strtof((char *)tokens,(char **)&local_c8);
    if (local_c8 != tokens) {
      if (*piVar4 == 0) {
        *piVar4 = iVar8;
        dd = fVar10;
        return;
      }
      if (*piVar4 != 0x22) {
        dd = fVar10;
        return;
      }
      std::__throw_out_of_range("stof");
      goto switchD_0010be61_caseD_5;
    }
    std::__throw_invalid_argument("stof");
LAB_0010c4c9:
    std::__throw_invalid_argument("stof");
LAB_0010c4d5:
    std::__throw_invalid_argument("stof");
LAB_0010c4e1:
    std::__throw_invalid_argument("stof");
LAB_0010c4ed:
    std::__throw_invalid_argument("stof");
LAB_0010c4f9:
    std::__throw_invalid_argument("stoi");
LAB_0010c505:
    std::__throw_invalid_argument("stof");
LAB_0010c511:
    std::__throw_invalid_argument("stof");
LAB_0010c51d:
    std::__throw_out_of_range("stoi");
LAB_0010c529:
    std::__throw_invalid_argument("stof");
LAB_0010c535:
    uVar6 = std::__throw_invalid_argument("stof");
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_c0);
    _Unwind_Resume(uVar6);
  case set_ds:
switchD_0010be61_caseD_d:
    using_translucent = true;
    using_phong = false;
    using_WARD = false;
    using_toon = false;
    using_sketch = false;
    tokens = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)(tokens->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
    piVar4 = __errno_location();
    iVar8 = *piVar4;
    *piVar4 = 0;
    fVar10 = strtof((char *)tokens,(char **)&local_c8);
    if (local_c8 != tokens) {
      if (*piVar4 == 0) {
        *piVar4 = iVar8;
        ds = fVar10;
        return;
      }
      if (*piVar4 != 0x22) {
        ds = fVar10;
        return;
      }
      std::__throw_out_of_range("stof");
      goto switchD_0010be61_caseD_a;
    }
    goto LAB_0010c4d5;
  case set_sketch:
    using_sketch = true;
    lVar5 = 0;
    using_translucent = false;
    using_phong = false;
    using_WARD = false;
    using_toon = false;
    fVar10 = 0.0;
    bVar1 = true;
    do {
      bVar7 = bVar1;
      fVar10 = fVar10 + line_dir[lVar5] * line_dir[lVar5];
      lVar5 = 1;
      bVar1 = false;
    } while (bVar7);
    if (fVar10 < 0.0) {
LAB_0010c36b:
      fVar10 = sqrtf(fVar10);
    }
    else {
      fVar10 = SQRT(fVar10);
    }
    fVar11 = line_dir[0];
    line_dir[1] = (1.0 / fVar10) * line_dir[1];
    line_dir[0] = (1.0 / fVar10) * fVar11;
  default:
    goto switchD_0010be61_default;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(pvVar9);
switchD_0010be61_default:
  return;
}

Assistant:

void read_cmd_tokens(const vector<string> tokens){

    switch (get_token_code(tokens[0])) {
        case ambient:
            record_token_rgb(ca, tokens);
            break;

        case diffuse:
            record_token_rgb(cr, tokens);
            break;
        
        case specular:
            record_token_rgb(cp, tokens);
            break;

        case set_pu:
            using_phong = false;
            using_WARD = true;
            using_toon = false;
            using_translucent = false;
            using_sketch = false;
            pu = 1.0f/stof(tokens[1]);
            break;
        
        case set_pv:
            using_phong = false;
            using_WARD = true;
            using_toon = false;
            using_translucent = false;
            using_sketch = false;
            pv = 1.0f/stof(tokens[1]);
            break;
        
        case set_p:
            using_phong = true;
            using_WARD = false;
            using_toon = false;
            using_translucent = false;
            using_sketch = false;
            p = stoi(tokens[1]);
            break;

        case add_dl:
            record_token_light(dls, dl_cs, tokens);
            break;

        case add_pl:
            record_token_light(pls, pl_cs, tokens);
            break;

        case toon:
            using_phong = true;
            using_WARD = false;
            using_toon = true;
            using_translucent = false;
            using_sketch = false;
            record_token_rgb(cc1, tokens);
            cc2[0] = stof(tokens[4]);
            cc2[1] = stof(tokens[5]);
            cc2[2] = stof(tokens[6]);
            break;

        case set_toon_layers:
            using_phong = true;
            using_WARD = false;
            using_toon = true;
            using_translucent = false;
            using_sketch = false;
            toonl = stof(tokens[1]);
            break;

        case set_depth:
            using_translucent = true;
            using_phong = false;
            using_WARD = false;
            using_toon = false;
            using_sketch = false;
            depth = stof(tokens[1]);
            break;

        case set_dd:
            using_translucent = true;
            using_phong = false;
            using_WARD = false;
            using_toon = false;
            using_sketch = false;
            dd = stof(tokens[1]);
            break;

        case set_ds:
            using_translucent = true;
            using_phong = false;
            using_WARD = false;
            using_toon = false;
            using_sketch = false;
            ds = stof(tokens[1]);
            break;

        case set_sketch:
            using_sketch = true;
            using_translucent = false;
            using_phong = false;
            using_WARD = false;
            using_toon = false;
            vec2_norm(line_dir, line_dir); //normalize line direction for sketch
            break;

        default:
            break;
    }

}